

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

PClassWeapon * Net_ReadWeapon(BYTE **stream)

{
  uint uVar1;
  int iVar2;
  PClassWeapon *pPVar3;
  
  uVar1 = ReadByte(stream);
  if ((char)uVar1 < '\0') {
    iVar2 = ReadByte(stream);
    uVar1 = uVar1 & 0x7f | iVar2 << 7;
  }
  if (uVar1 < Weapons_ntoh.Count) {
    pPVar3 = Weapons_ntoh.Array[(int)uVar1];
  }
  else {
    pPVar3 = (PClassWeapon *)0x0;
  }
  return pPVar3;
}

Assistant:

PClassWeapon *Net_ReadWeapon(BYTE **stream)
{
	int index;

	index = ReadByte(stream);
	if (index & 0x80)
	{
		index = (index & 0x7F) | (ReadByte(stream) << 7);
	}
	if ((unsigned)index >= Weapons_ntoh.Size())
	{
		return NULL;
	}
	return Weapons_ntoh[index];
}